

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_sum(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
             lyxp_set *set,int options)

{
  undefined8 uVar1;
  lyxp_set_type lVar2;
  undefined8 *__ptr;
  longdouble *__return_storage_ptr__;
  char *pcVar3;
  LY_ERR *pLVar4;
  ushort uVar5;
  lyd_node *str;
  lyxp_set *set_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  undefined1 local_88 [8];
  lyxp_set set_item;
  
  set_fill_number(set,(longdouble)0);
  set_00 = *args;
  lVar2 = set_00->type;
  if (lVar2 != LYXP_SET_EMPTY) {
    if (lVar2 == LYXP_SET_NODE_SET) {
      local_88._0_4_ = LYXP_SET_NODE_SET;
      __ptr = (undefined8 *)malloc(0x10);
      set_item._8_8_ = __ptr;
      if (__ptr == (undefined8 *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","xpath_sum");
      }
      else {
        set_item.val._8_8_ = 0x100000001;
        uVar5 = 0;
        while( true ) {
          if (set_00->used <= (uint)uVar5) {
            free(__ptr);
            return 0;
          }
          uVar1 = *(undefined8 *)&(set_00->val).nodes[uVar5].type;
          *__ptr = (set_00->val).nodes[uVar5].node;
          __ptr[1] = uVar1;
          str = cur_node;
          __return_storage_ptr__ =
               (longdouble *)cast_node_set_to_string((lyxp_set *)local_88,cur_node,param_4,options);
          if (__return_storage_ptr__ == (longdouble *)0x0) break;
          cast_string_to_number(__return_storage_ptr__,(char *)str);
          unique0x10000283 = in_ST0;
          free(__return_storage_ptr__);
          (set->val).num = stack0xffffffffffffffac + (set->val).num;
          uVar5 = uVar5 + 1;
          set_00 = *args;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
        }
      }
    }
    else {
      pcVar3 = print_set_type(set_00);
      ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar3,"sum(node-set)");
    }
    lVar2 = ~LYXP_SET_EMPTY;
  }
  return lVar2;
}

Assistant:

static int
xpath_sum(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
          struct lyxp_set *set, int options)
{
    long double num;
    char *str;
    uint16_t i;
    struct lyxp_set set_item;

    set_fill_number(set, 0);
    if (args[0]->type == LYXP_SET_EMPTY) {
        return EXIT_SUCCESS;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "sum(node-set)");
        return -1;
    }

    set_item.type = LYXP_SET_NODE_SET;
    set_item.val.nodes = malloc(sizeof *set_item.val.nodes);
    if (!set_item.val.nodes) {
        LOGMEM;
        return -1;
    }

    set_item.used = 1;
    set_item.size = 1;

    for (i = 0; i < args[0]->used; ++i) {
        set_item.val.nodes[0] = args[0]->val.nodes[i];

        str = cast_node_set_to_string(&set_item, cur_node, local_mod, options);
        if (!str) {
            return -1;
        }
        num = cast_string_to_number(str);
        free(str);
        set->val.num += num;
    }

    free(set_item.val.nodes);

    return EXIT_SUCCESS;
}